

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O3

int TIFFWriteDirectoryTagShortPerSample
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint16_t value)

{
  ushort uVar1;
  int iVar2;
  uint16_t *value_00;
  long lVar3;
  uint32_t count;
  
  if (dir == (TIFFDirEntry *)0x0) {
    *ndir = *ndir + 1;
    iVar2 = 1;
  }
  else {
    value_00 = (uint16_t *)_TIFFmallocExt(tif,(ulong)((uint)(tif->tif_dir).td_samplesperpixel * 2));
    if (value_00 == (uint16_t *)0x0) {
      iVar2 = 0;
      TIFFErrorExtR(tif,"TIFFWriteDirectoryTagShortPerSample","Out of memory");
    }
    else {
      if ((tif->tif_dir).td_samplesperpixel == 0) {
        count = 0;
      }
      else {
        lVar3 = 0;
        do {
          value_00[lVar3] = value;
          uVar1 = (tif->tif_dir).td_samplesperpixel;
          count = (uint32_t)uVar1;
          lVar3 = lVar3 + 1;
        } while ((ushort)lVar3 < uVar1);
      }
      iVar2 = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,count,value_00);
      _TIFFfreeExt(tif,value_00);
    }
  }
  return iVar2;
}

Assistant:

static int TIFFWriteDirectoryTagShortPerSample(TIFF *tif, uint32_t *ndir,
                                               TIFFDirEntry *dir, uint16_t tag,
                                               uint16_t value)
{
    static const char module[] = "TIFFWriteDirectoryTagShortPerSample";
    uint16_t *m;
    uint16_t *na;
    uint16_t nb;
    int o;
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    m = _TIFFmallocExt(tif, tif->tif_dir.td_samplesperpixel * sizeof(uint16_t));
    if (m == NULL)
    {
        TIFFErrorExtR(tif, module, "Out of memory");
        return (0);
    }
    for (na = m, nb = 0; nb < tif->tif_dir.td_samplesperpixel; na++, nb++)
        *na = value;
    o = TIFFWriteDirectoryTagCheckedShortArray(
        tif, ndir, dir, tag, tif->tif_dir.td_samplesperpixel, m);
    _TIFFfreeExt(tif, m);
    return (o);
}